

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManCutSupp(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  pVVar2 = Llb_ManCutNodes(p,vLower,vUpper);
  Aig_ManIncrementTravId(p);
  iVar6 = pVVar2->nSize;
  ppvVar3 = pVVar2->pArray;
  if ((long)iVar6 < 1) {
    if (ppvVar3 == (void **)0x0) goto LAB_0082b3ad;
  }
  else {
    lVar4 = 0;
    do {
      pvVar1 = ppvVar3[lVar4];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                      ,0x19b,"Vec_Ptr_t *Llb_ManCutSupp(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      iVar8 = p->nTravIds;
      *(int *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x20) = iVar8;
      *(int *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x20) = iVar8;
      lVar4 = lVar4 + 1;
    } while (iVar6 != lVar4);
  }
  free(ppvVar3);
LAB_0082b3ad:
  free(pVVar2);
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  iVar6 = vLower->nSize;
  if (0 < iVar6) {
    iVar8 = 0;
    uVar7 = 100;
    lVar4 = 0;
    do {
      pvVar1 = vLower->pArray[lVar4];
      if (*(int *)((long)pvVar1 + 0x20) == p->nTravIds) {
        iVar6 = (int)uVar7;
        if (iVar8 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uint)(iVar6 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar7 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar7 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar5 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar2->nSize = iVar8;
        ppvVar3[lVar5] = pvVar1;
        iVar6 = vLower->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar6);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupp( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes, * vSupp;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    // mark support of the nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin1(pObj) );
    }
    Vec_PtrFree( vNodes );
    // collect the support nodes
    vSupp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vSupp, pObj );
    return vSupp;

}